

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AcousticEmitterSystemData.cpp
# Opt level: O1

void __thiscall
DIS::AcousticEmitterSystemData::unmarshal(AcousticEmitterSystemData *this,DataStream *dataStream)

{
  uchar *c;
  pointer pAVar1;
  pointer pAVar2;
  pointer pAVar3;
  ulong uVar4;
  AcousticBeamData x;
  AcousticBeamData local_60;
  
  DataStream::operator>>(dataStream,&this->_emitterSystemDataLength);
  c = &this->_numberOfBeams;
  DataStream::operator>>(dataStream,c);
  DataStream::operator>>(dataStream,&this->_pad2);
  AcousticEmitterSystem::unmarshal(&this->_acousticEmitterSystem,dataStream);
  Vector3Float::unmarshal(&this->_emitterLocation,dataStream);
  pAVar1 = (this->_beamRecords).
           super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>._M_impl
           .super__Vector_impl_data._M_start;
  pAVar2 = (this->_beamRecords).
           super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>._M_impl
           .super__Vector_impl_data._M_finish;
  pAVar3 = pAVar1;
  if (pAVar2 != pAVar1) {
    do {
      (**pAVar3->_vptr_AcousticBeamData)(pAVar3);
      pAVar3 = pAVar3 + 1;
    } while (pAVar3 != pAVar2);
    (this->_beamRecords).
    super__Vector_base<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>._M_impl.
    super__Vector_impl_data._M_finish = pAVar1;
  }
  if (*c != '\0') {
    uVar4 = 0;
    do {
      AcousticBeamData::AcousticBeamData(&local_60);
      AcousticBeamData::unmarshal(&local_60,dataStream);
      std::vector<DIS::AcousticBeamData,_std::allocator<DIS::AcousticBeamData>_>::push_back
                (&this->_beamRecords,&local_60);
      AcousticBeamData::~AcousticBeamData(&local_60);
      uVar4 = uVar4 + 1;
    } while (uVar4 < *c);
  }
  return;
}

Assistant:

void AcousticEmitterSystemData::unmarshal(DataStream& dataStream)
{
    dataStream >> _emitterSystemDataLength;
    dataStream >> _numberOfBeams;
    dataStream >> _pad2;
    _acousticEmitterSystem.unmarshal(dataStream);
    _emitterLocation.unmarshal(dataStream);

     _beamRecords.clear();
     for(size_t idx = 0; idx < _numberOfBeams; idx++)
     {
        AcousticBeamData x;
        x.unmarshal(dataStream);
        _beamRecords.push_back(x);
     }
}